

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::ExtensionSet::SetRepeatedEnum
          (ExtensionSet *this,int number,int index,int value)

{
  byte bVar1;
  _Base_ptr p_Var2;
  LogMessage *pLVar3;
  _Rb_tree_header *p_Var4;
  _Base_ptr p_Var5;
  LogFinisher local_61;
  LogMessage local_60;
  
  p_Var2 = (this->extensions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var4 = &(this->extensions_)._M_t._M_impl.super__Rb_tree_header;
  p_Var5 = &p_Var4->_M_header;
  if (p_Var2 != (_Base_ptr)0x0) {
    do {
      if (number <= (int)p_Var2[1]._M_color) {
        p_Var5 = p_Var2;
      }
      p_Var2 = (&p_Var2->_M_left)[(int)p_Var2[1]._M_color < number];
    } while (p_Var2 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var5 != p_Var4) && ((int)p_Var5[1]._M_color <= number))
    goto LAB_001ff460;
  }
  LogMessage::LogMessage
            (&local_60,LOGLEVEL_DFATAL,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
             ,0x160);
  pLVar3 = LogMessage::operator<<(&local_60,"CHECK failed: iter != extensions_.end(): ");
  pLVar3 = LogMessage::operator<<(pLVar3,"Index out-of-bounds (field is empty).");
  LogFinisher::operator=(&local_61,pLVar3);
  LogMessage::~LogMessage(&local_60);
  p_Var5 = &p_Var4->_M_header;
LAB_001ff460:
  if (*(char *)((long)&p_Var5[1]._M_left + 1) == '\0') {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
               ,0x161);
    pLVar3 = LogMessage::operator<<
                       (&local_60,
                        "CHECK failed: ((iter->second).is_repeated ? REPEATED : OPTIONAL) == (REPEATED): "
                       );
    LogFinisher::operator=(&local_61,pLVar3);
    LogMessage::~LogMessage(&local_60);
  }
  bVar1 = *(byte *)&p_Var5[1]._M_left;
  if ((byte)(bVar1 - 0x13) < 0xee) {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
               ,0x35);
    pLVar3 = LogMessage::operator<<
                       (&local_60,
                        "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
    LogFinisher::operator=(&local_61,pLVar3);
    LogMessage::~LogMessage(&local_60);
  }
  if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar1 * 4) != 8) {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
               ,0x161);
    pLVar3 = LogMessage::operator<<
                       (&local_60,
                        "CHECK failed: (cpp_type((iter->second).type)) == (WireFormatLite::CPPTYPE_ENUM): "
                       );
    LogFinisher::operator=(&local_61,pLVar3);
    LogMessage::~LogMessage(&local_60);
  }
  p_Var2 = p_Var5[1]._M_parent;
  if (*(int *)&p_Var2->_M_parent <= index) {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
               ,0x271);
    pLVar3 = LogMessage::operator<<(&local_60,"CHECK failed: (index) < (size()): ");
    LogFinisher::operator=(&local_61,pLVar3);
    LogMessage::~LogMessage(&local_60);
  }
  *(int *)(*(long *)p_Var2 + (long)index * 4) = value;
  return;
}

Assistant:

void ExtensionSet::SetRepeatedEnum(int number, int index, int value) {
  map<int, Extension>::iterator iter = extensions_.find(number);
  GOOGLE_CHECK(iter != extensions_.end()) << "Index out-of-bounds (field is empty).";
  GOOGLE_DCHECK_TYPE(iter->second, REPEATED, ENUM);
  iter->second.repeated_enum_value->Set(index, value);
}